

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeChakraLibraryObject
               (DynamicObject *chakraLibraryObject,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  Type *pTVar1;
  JavascriptFunction **ppJVar2;
  RuntimeFunction **ppRVar3;
  JavascriptFunction *ptr;
  JavascriptFunction *func;
  Type *builtinFuncs;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *chakraLibraryObject_local;
  
  this = RecyclableObject::GetLibrary(&chakraLibraryObject->super_RecyclableObject);
  DeferredTypeHandlerBase::Convert(typeHandler,chakraLibraryObject,mode,8,0);
  pTVar1 = GetBuiltinFunctions(this);
  AddFunctionToLibraryObject
            (this,chakraLibraryObject,0x280,
             (FunctionInfo *)
             JsBuiltInEngineInterfaceExtensionObject::EntryInfo::JsBuiltIn_Internal_ToLengthFunction
             ,1,'\x06');
  AddFunctionToLibraryObject
            (this,chakraLibraryObject,0x281,
             (FunctionInfo *)
             JsBuiltInEngineInterfaceExtensionObject::EntryInfo::
             JsBuiltIn_Internal_ToIntegerFunction,1,'\x06');
  AddFunctionToLibraryObject
            (this,chakraLibraryObject,0x27c,
             (FunctionInfo *)
             JsBuiltInEngineInterfaceExtensionObject::EntryInfo::JsBuiltIn_Internal_GetLength,1,
             '\x06');
  AddFunctionToLibraryObject
            (this,chakraLibraryObject,0x27d,
             (FunctionInfo *)
             JsBuiltInEngineInterfaceExtensionObject::EntryInfo::
             JsBuiltIn_Internal_InitInternalProperties,1,'\x06');
  ppJVar2 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                      ((WriteBarrierPtr *)&this->isArrayFunction);
  AddMember(this,chakraLibraryObject,0xbe,*ppJVar2);
  ppRVar3 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).objectConstructor);
  AddMember(this,chakraLibraryObject,0x111,*ppRVar3);
  AddFunctionToLibraryObject
            (this,chakraLibraryObject,0x282,
             (FunctionInfo *)
             JsBuiltInEngineInterfaceExtensionObject::EntryInfo::
             JsBuiltIn_Internal_ArraySpeciesCreate,2,'\x06');
  AddFunctionToLibraryObject
            (this,chakraLibraryObject,0x283,
             (FunctionInfo *)
             JsBuiltInEngineInterfaceExtensionObject::EntryInfo::
             JsBuiltIn_Internal_ArrayCreateDataPropertyOrThrow,3,'\x06');
  ptr = AddFunctionToLibraryObject
                  (this,chakraLibraryObject,0x28b,
                   (FunctionInfo *)EngineInterfaceObject::EntryInfo::CallInstanceFunction,1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(pTVar1 + 0x3e,ptr);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeChakraLibraryObject(DynamicObject * chakraLibraryObject, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        JavascriptLibrary* library = chakraLibraryObject->GetLibrary();
        typeHandler->Convert(chakraLibraryObject, mode, 8);

        Field(JavascriptFunction*)* builtinFuncs = library->GetBuiltinFunctions();
        JavascriptFunction * func = nullptr;

        library->AddFunctionToLibraryObject(chakraLibraryObject, PropertyIds::toLength, &JsBuiltInEngineInterfaceExtensionObject::EntryInfo::JsBuiltIn_Internal_ToLengthFunction, 1);
        library->AddFunctionToLibraryObject(chakraLibraryObject, PropertyIds::toInteger, &JsBuiltInEngineInterfaceExtensionObject::EntryInfo::JsBuiltIn_Internal_ToIntegerFunction, 1);
        library->AddFunctionToLibraryObject(chakraLibraryObject, PropertyIds::GetLength, &JsBuiltInEngineInterfaceExtensionObject::EntryInfo::JsBuiltIn_Internal_GetLength, 1);
        library->AddFunctionToLibraryObject(chakraLibraryObject, PropertyIds::InitInternalProperties, &JsBuiltInEngineInterfaceExtensionObject::EntryInfo::JsBuiltIn_Internal_InitInternalProperties, 1);
        library->AddMember(chakraLibraryObject, PropertyIds::isArray, library->isArrayFunction);
        library->AddMember(chakraLibraryObject, PropertyIds::Object, library->objectConstructor);
        library->AddFunctionToLibraryObject(chakraLibraryObject, PropertyIds::arraySpeciesCreate, &JsBuiltInEngineInterfaceExtensionObject::EntryInfo::JsBuiltIn_Internal_ArraySpeciesCreate, 2);
        library->AddFunctionToLibraryObject(chakraLibraryObject, PropertyIds::arrayCreateDataPropertyOrThrow, &JsBuiltInEngineInterfaceExtensionObject::EntryInfo::JsBuiltIn_Internal_ArrayCreateDataPropertyOrThrow, 3);
        func = library->AddFunctionToLibraryObject(chakraLibraryObject, PropertyIds::builtInCallInstanceFunction, &EngineInterfaceObject::EntryInfo::CallInstanceFunction, 1);
        builtinFuncs[BuiltinFunction::EngineInterfaceObject_CallInstanceFunction] = func;

        return true;
    }